

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperOffset::DoSquare(ClipperOffset *this,int j,int k)

{
  pointer *ppIVar1;
  double dVar2;
  pointer pDVar3;
  pointer pIVar4;
  iterator iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  IntPoint local_38;
  double local_28;
  
  pDVar3 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar7 = atan2(this->m_sinA,pDVar3[k].X * pDVar3[j].X + pDVar3[k].Y * pDVar3[j].Y);
  dVar8 = tan(dVar7 * 0.25);
  pIVar4 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar7 = pDVar3[k].X;
  dVar2 = pDVar3[k].Y;
  dVar9 = (dVar7 - dVar2 * dVar8) * this->m_delta + (double)pIVar4[j].X;
  uVar6 = -(ulong)(dVar9 < 0.0);
  local_38.X = (cInt)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar9);
  dVar7 = (dVar7 * dVar8 + dVar2) * this->m_delta + (double)pIVar4[j].Y;
  uVar6 = -(ulong)(dVar7 < 0.0);
  local_38.Y = (cInt)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar7);
  iVar5._M_current =
       (this->m_destPoly).
       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_28 = dVar8;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar5,&local_38);
    dVar8 = local_28;
  }
  else {
    (iVar5._M_current)->X = local_38.X;
    (iVar5._M_current)->Y = local_38.Y;
    ppIVar1 = &(this->m_destPoly).
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  pIVar4 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar7 = pDVar3[j].X;
  dVar2 = pDVar3[j].Y;
  dVar9 = (dVar2 * dVar8 + dVar7) * this->m_delta + (double)pIVar4[j].X;
  uVar6 = -(ulong)(dVar9 < 0.0);
  local_38.X = (cInt)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar9);
  dVar7 = (dVar2 - dVar7 * dVar8) * this->m_delta + (double)pIVar4[j].Y;
  uVar6 = -(ulong)(dVar7 < 0.0);
  local_38.Y = (cInt)((double)(~uVar6 & 0x3fe0000000000000 | uVar6 & 0xbfe0000000000000) + dVar7);
  iVar5._M_current =
       (this->m_destPoly).
       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar5,&local_38);
  }
  else {
    (iVar5._M_current)->X = local_38.X;
    (iVar5._M_current)->Y = local_38.Y;
    ppIVar1 = &(this->m_destPoly).
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return;
}

Assistant:

void ClipperOffset::DoSquare(int j, int k)
{
  double dx = std::tan(std::atan2(m_sinA,
      m_normals[k].X * m_normals[j].X + m_normals[k].Y * m_normals[j].Y) / 4);
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[k].X - m_normals[k].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[k].Y + m_normals[k].X * dx))));
  m_destPoly.push_back(IntPoint(
      Round(m_srcPoly[j].X + m_delta * (m_normals[j].X + m_normals[j].Y * dx)),
      Round(m_srcPoly[j].Y + m_delta * (m_normals[j].Y - m_normals[j].X * dx))));
}